

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_copy(lua_State *L,int fromidx,int toidx)

{
  int iVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *io2;
  TValue *io1;
  TValue *to;
  TValue *fr;
  int toidx_local;
  int fromidx_local;
  lua_State *L_local;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xe5,"void lua_copy(lua_State *, int, int)");
  }
  pTVar2 = index2addr(L,fromidx);
  pTVar3 = index2addr(L,toidx);
  if (pTVar3 == &luaO_nilobject_) {
    __assert_fail("(((to) != (&luaO_nilobject_))) && \"invalid index\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xe8,"void lua_copy(lua_State *, int, int)");
  }
  pTVar3->value_ = pTVar2->value_;
  pTVar3->tt_ = pTVar2->tt_;
  if ((pTVar3->tt_ & 0x8000) != 0) {
    if ((pTVar3->tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xe9,"void lua_copy(lua_State *, int, int)");
    }
    if ((pTVar3->tt_ & 0x7f) != (ushort)((pTVar3->value_).gc)->tt) {
LAB_00113cb3:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xe9,"void lua_copy(lua_State *, int, int)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar3->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0xe9,"void lua_copy(lua_State *, int, int)");
      }
      if ((((pTVar3->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00113cb3;
    }
  }
  if ((toidx < -0xf4628) && ((pTVar2->tt_ & 0x8000) != 0)) {
    if (L->ci->func->tt_ != 0x8026) {
      __assert_fail("((((L->ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xeb,"void lua_copy(lua_State *, int, int)");
    }
    if (((L->ci->func->value_).gc)->tt != '&') {
      __assert_fail("(((L->ci->func)->value_).gc)->tt == ((6) | ((2) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xeb,"void lua_copy(lua_State *, int, int)");
    }
    if ((((L->ci->func->value_).gc)->marked & 0x20) != 0) {
      if ((pTVar2->tt_ & 0x8000) == 0) {
        __assert_fail("(((fr)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0xeb,"void lua_copy(lua_State *, int, int)");
      }
      if ((((pTVar2->value_).gc)->marked & 0x18) != 0) {
        if (L->ci->func->tt_ != 0x8026) {
          __assert_fail("((((L->ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0xeb,"void lua_copy(lua_State *, int, int)");
        }
        if (((L->ci->func->value_).gc)->tt != '&') {
          __assert_fail("(((L->ci->func)->value_).gc)->tt == ((6) | ((2) << 4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0xeb,"void lua_copy(lua_State *, int, int)");
        }
        if (9 < (((L->ci->func->value_).gc)->tt & 0xf)) {
          __assert_fail("((((((void) sizeof ((((((L->ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))) ? 1 : 0), __extension__ ({ if (((((L->ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))) ; else __assert_fail (\"((((L->ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c\", 235, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((L->ci->func)->value_).gc)->tt == ((6) | ((2) << 4))) ? 1 : 0), __extension__ ({ if ((((L->ci->func)->value_).gc)->tt == ((6) | ((2) << 4))) ; else __assert_fail (\"(((L->ci->func)->value_).gc)->tt == ((6) | ((2) << 4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c\", 235, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((L->ci->func)->value_).gc))))->cl.c))))))->tt) & 0x0F) < (9+1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0xeb,"void lua_copy(lua_State *, int, int)");
        }
        if (L->ci->func->tt_ != 0x8026) {
          __assert_fail("((((L->ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0xeb,"void lua_copy(lua_State *, int, int)");
        }
        if (((L->ci->func->value_).gc)->tt != '&') {
          __assert_fail("(((L->ci->func)->value_).gc)->tt == ((6) | ((2) << 4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0xeb,"void lua_copy(lua_State *, int, int)");
        }
        if ((pTVar2->tt_ & 0x8000) == 0) {
          __assert_fail("(((fr)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0xeb,"void lua_copy(lua_State *, int, int)");
        }
        luaC_barrier_(L,(L->ci->func->value_).gc,(pTVar2->value_).gc);
      }
    }
  }
  iVar1 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar1;
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0xee,"void lua_copy(lua_State *, int, int)");
}

Assistant:

LUA_API void lua_copy (lua_State *L, int fromidx, int toidx) {
  TValue *fr, *to;
  lua_lock(L);
  fr = index2addr(L, fromidx);
  to = index2addr(L, toidx);
  api_checkvalidindex(L, to);
  setobj(L, to, fr);
  if (isupvalue(toidx))  /* function upvalue? */
    luaC_barrier(L, clCvalue(L->ci->func), fr);
  /* LUA_REGISTRYINDEX does not need gc barrier
     (collector revisits it before finishing collection) */
  lua_unlock(L);
}